

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::NetworkAddressHttpClient>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::NetworkAddressHttpClient> *this,void *pointer)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong uVar8;
  PromiseArenaMember *node;
  long *plVar9;
  ulong uVar10;
  void *pvVar11;
  undefined8 *puVar12;
  long lVar13;
  undefined8 *puVar14;
  
  if (pointer != (void *)0x0) {
    puVar14 = *(undefined8 **)((long)pointer + 0x88);
    puVar1 = *(undefined8 **)((long)pointer + 0x98);
    plVar2 = *(long **)((long)pointer + 0xa0);
    puVar3 = *(undefined8 **)((long)pointer + 0xa8);
    puVar12 = *(undefined8 **)((long)pointer + 0xb0);
    plVar4 = *(long **)((long)pointer + 0xc0);
    plVar9 = plVar2;
    while (plVar9 = plVar9 + 1, plVar9 < plVar4) {
      lVar5 = *plVar9;
      lVar13 = 8;
      do {
        plVar6 = *(long **)(lVar5 + lVar13);
        if (plVar6 != (long *)0x0) {
          *(undefined8 *)(lVar5 + lVar13) = 0;
          puVar7 = *(undefined8 **)(lVar5 + -8 + lVar13);
          (**(code **)*puVar7)(puVar7,(long)plVar6 + *(long *)(*plVar6 + -0x10));
        }
        lVar13 = lVar13 + 0x18;
      } while (lVar13 != 0x200);
    }
    if (plVar2 == plVar4) {
      for (; puVar14 != puVar3; puVar14 = puVar14 + 3) {
        plVar2 = (long *)puVar14[1];
        if (plVar2 != (long *)0x0) {
          puVar14[1] = 0;
          (*(code *)**(undefined8 **)*puVar14)
                    ((undefined8 *)*puVar14,(long)plVar2 + *(long *)(*plVar2 + -0x10));
        }
      }
    }
    else {
      for (; puVar14 != puVar1; puVar14 = puVar14 + 3) {
        plVar2 = (long *)puVar14[1];
        if (plVar2 != (long *)0x0) {
          puVar14[1] = 0;
          (*(code *)**(undefined8 **)*puVar14)
                    ((undefined8 *)*puVar14,(long)plVar2 + *(long *)(*plVar2 + -0x10));
        }
      }
      for (; puVar12 != puVar3; puVar12 = puVar12 + 3) {
        plVar2 = (long *)puVar12[1];
        if (plVar2 != (long *)0x0) {
          puVar12[1] = 0;
          (*(code *)**(undefined8 **)*puVar12)
                    ((undefined8 *)*puVar12,(long)plVar2 + *(long *)(*plVar2 + -0x10));
        }
      }
    }
    pvVar11 = *(void **)((long)pointer + 0x78);
    if (pvVar11 != (void *)0x0) {
      uVar8 = *(ulong *)((long)pointer + 0xc0);
      if (*(ulong *)((long)pointer + 0xa0) < uVar8 + 8) {
        uVar10 = *(ulong *)((long)pointer + 0xa0) - 8;
        do {
          puVar14 = (undefined8 *)(uVar10 + 8);
          uVar10 = uVar10 + 8;
          operator_delete((void *)*puVar14,0x1f8);
        } while (uVar10 < uVar8);
        pvVar11 = *(void **)((long)pointer + 0x78);
      }
      operator_delete(pvVar11,*(long *)((long)pointer + 0x80) << 3);
    }
    node = *(PromiseArenaMember **)((long)pointer + 0x70);
    if (node != (PromiseArenaMember *)0x0) {
      *(undefined8 *)((long)pointer + 0x70) = 0;
      PromiseDisposer::dispose(node);
    }
    plVar2 = *(long **)((long)pointer + 0x60);
    if (plVar2 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x60) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x58))
                (*(undefined8 **)((long)pointer + 0x58),(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    plVar2 = *(long **)((long)pointer + 0x20);
    if (plVar2 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x20) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x18))
                (*(undefined8 **)((long)pointer + 0x18),(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
  }
  operator_delete(pointer,200);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }